

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void ecs_hash(void *data,ecs_size_t length,uint64_t *result)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  
  sVar1 = ecs_to_size_t((long)length);
  uVar2 = (int)sVar1 + 0xdeadbeef;
  uVar6 = uVar2;
  uVar8 = uVar2;
  if (((ulong)data & 3) != 0) {
    uVar5 = uVar2;
    if (((ulong)data & 1) != 0) {
      pbVar9 = (byte *)((long)data + 0xb);
      do {
        uVar4 = (ulong)uVar8;
        switch(sVar1) {
        case 0:
          goto switchD_00112db0_caseD_0;
        case 0xc:
          uVar2 = uVar2 + (uint)*pbVar9 * 0x1000000;
        case 0xb:
          uVar2 = uVar2 + (uint)pbVar9[-1] * 0x10000;
        case 10:
          uVar2 = uVar2 + (uint)pbVar9[-2] * 0x100;
        case 9:
          uVar2 = uVar2 + pbVar9[-3];
        case 8:
          uVar8 = (uint)pbVar9[-4] * 0x1000000 + uVar8;
        case 7:
          uVar8 = (uint)pbVar9[-5] * 0x10000 + uVar8;
        case 6:
          uVar8 = (uint)pbVar9[-6] * 0x100 + uVar8;
        case 5:
          uVar8 = pbVar9[-7] + uVar8;
        case 4:
          uVar6 = uVar6 + (uint)pbVar9[-8] * 0x1000000;
        case 3:
          uVar6 = uVar6 + (uint)pbVar9[-9] * 0x10000;
        case 2:
          uVar6 = uVar6 + (uint)pbVar9[-10] * 0x100;
        case 1:
          uVar5 = (uint)pbVar9[-0xb];
          goto LAB_00112e97;
        default:
          iVar3 = (uint)pbVar9[-4] * 0x1000000 + (uint)pbVar9[-5] * 0x10000 +
                  (uint)pbVar9[-6] * 0x100 + uVar8 + pbVar9[-7];
          uVar2 = (uint)*pbVar9 * 0x1000000 + (uint)pbVar9[-1] * 0x10000 +
                  (uint)pbVar9[-2] * 0x100 + uVar2 + pbVar9[-3];
          uVar8 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^
                  ((uint)pbVar9[-8] * 0x1000000 + (uint)pbVar9[-9] * 0x10000 +
                  (uint)pbVar9[-10] * 0x100 + uVar6 + pbVar9[-0xb]) - uVar2;
          iVar7 = uVar2 + iVar3;
          uVar6 = (uVar8 << 6 | uVar8 >> 0x1a) ^ iVar3 - uVar8;
          iVar3 = uVar8 + iVar7;
          uVar8 = (uVar6 << 8 | uVar6 >> 0x18) ^ iVar7 - uVar6;
          iVar7 = uVar6 + iVar3;
          uVar6 = (uVar8 << 0x10 | uVar8 >> 0x10) ^ iVar3 - uVar8;
          iVar3 = uVar8 + iVar7;
          uVar8 = (uVar6 << 0x13 | uVar6 >> 0xd) ^ iVar7 - uVar6;
          uVar6 = uVar6 + iVar3;
          uVar2 = (uVar8 << 4 | uVar8 >> 0x1c) ^ iVar3 - uVar8;
          uVar8 = uVar8 + uVar6;
          sVar1 = sVar1 - 0xc;
          pbVar9 = pbVar9 + 0xc;
        }
      } while( true );
    }
LAB_00112bc2:
    uVar4 = (ulong)uVar8;
    switch(sVar1) {
    case 0:
      goto switchD_00112db0_caseD_0;
    case 1:
      uVar6 = (uint)(byte)*data;
      goto LAB_00112ed0;
    case 2:
      goto switchD_00112db0_caseD_2;
    case 3:
      uVar5 = uVar5 + (uint)(byte)*(ushort *)((long)data + 2) * 0x10000;
switchD_00112db0_caseD_2:
      uVar6 = (uint)*data;
LAB_00112ed0:
      uVar5 = uVar5 + uVar6;
      goto LAB_00112eec;
    case 4:
      goto switchD_00112db0_caseD_4;
    case 5:
      uVar8 = uVar8 + (byte)*(ushort *)((long)data + 4);
      goto switchD_00112db0_caseD_4;
    case 6:
      goto switchD_00112db0_caseD_6;
    case 7:
      uVar8 = (uint)(byte)*(ushort *)((long)data + 6) * 0x10000 + uVar8;
switchD_00112db0_caseD_6:
      uVar8 = *(ushort *)((long)data + 4) + uVar8;
      uVar5 = uVar5 + *data;
      goto LAB_00112eec;
    case 8:
      break;
    case 9:
      uVar6 = (uint)(byte)*(ushort *)((long)data + 8);
      goto LAB_00112eb7;
    case 10:
      goto switchD_00112db0_caseD_a;
    case 0xb:
      uVar2 = uVar2 + (uint)(byte)*(ushort *)((long)data + 10) * 0x10000;
switchD_00112db0_caseD_a:
      uVar6 = (uint)*(ushort *)((long)data + 8);
LAB_00112eb7:
      uVar2 = uVar2 + uVar6;
      break;
    case 0xc:
      uVar2 = uVar2 + *(int *)((long)data + 8);
      break;
    default:
      goto switchD_00112db0_default;
    }
    uVar8 = uVar8 + *(int *)((long)data + 4);
switchD_00112db0_caseD_4:
    uVar5 = uVar5 + *data;
    goto LAB_00112eec;
  }
LAB_00112c37:
  uVar4 = (ulong)uVar8;
  switch(sVar1) {
  case 1:
    uVar5 = (uint)(byte)*data;
    goto LAB_00112e97;
  case 2:
    uVar5 = (uint)(ushort)*data;
    goto LAB_00112e97;
  case 3:
    uVar5 = *data & 0xffffff;
    goto LAB_00112e97;
  case 4:
    goto switchD_00112cb2_caseD_4;
  case 5:
    uVar5 = (uint)(byte)*(uint *)((long)data + 4);
    break;
  case 6:
    uVar5 = (uint)(ushort)*(uint *)((long)data + 4);
    break;
  case 7:
    uVar5 = *(uint *)((long)data + 4) & 0xffffff;
    break;
  case 8:
    goto switchD_00112cb2_caseD_8;
  case 9:
    uVar5 = (uint)(byte)*(uint *)((long)data + 8);
    goto LAB_00112e8e;
  case 10:
    uVar5 = (uint)(ushort)*(uint *)((long)data + 8);
    goto LAB_00112e8e;
  case 0xb:
    uVar5 = *(uint *)((long)data + 8) & 0xffffff;
LAB_00112e8e:
    uVar2 = uVar2 + uVar5;
switchD_00112cb2_caseD_8:
    uVar8 = uVar8 + *(uint *)((long)data + 4);
switchD_00112cb2_caseD_4:
    uVar5 = *data;
LAB_00112e97:
    uVar5 = uVar5 + uVar6;
LAB_00112eec:
    uVar6 = (uVar2 ^ uVar8) - (uVar8 << 0xe | uVar8 >> 0x12);
    uVar5 = (uVar5 ^ uVar6) - (uVar6 * 0x800 | uVar6 >> 0x15);
    uVar2 = (uVar8 ^ uVar5) - (uVar5 * 0x2000000 | uVar5 >> 7);
    uVar8 = (uVar6 ^ uVar2) - (uVar2 * 0x10000 | uVar2 >> 0x10);
    uVar6 = (uVar5 ^ uVar8) - (uVar8 * 0x10 | uVar8 >> 0x1c);
    uVar6 = (uVar2 ^ uVar6) - (uVar6 * 0x4000 | uVar6 >> 0x12);
    uVar4 = (ulong)uVar6;
    uVar2 = (uVar8 ^ uVar6) - (uVar6 * 0x1000000 | uVar6 >> 8);
  case 0:
switchD_00112db0_caseD_0:
    *result = uVar4 << 0x20 | (ulong)uVar2;
    return;
  case 0xc:
    uVar2 = uVar2 + *(uint *)((long)data + 8);
    goto switchD_00112cb2_caseD_8;
  default:
    goto switchD_00112cb2_default;
  }
  uVar8 = uVar5 + uVar8;
  uVar5 = *data;
  goto LAB_00112e97;
switchD_00112db0_default:
  uVar2 = uVar2 + *(int *)((long)data + 8);
  uVar6 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar5 + *data) - uVar2;
  iVar3 = uVar2 + uVar8 + *(int *)((long)data + 4);
  uVar8 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar8 + *(int *)((long)data + 4)) - uVar6;
  iVar7 = uVar6 + iVar3;
  uVar6 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar3 - uVar8;
  iVar3 = uVar8 + iVar7;
  uVar5 = (uVar6 << 0x10 | uVar6 >> 0x10) ^ iVar7 - uVar6;
  iVar7 = uVar6 + iVar3;
  uVar8 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar3 - uVar5;
  uVar5 = uVar5 + iVar7;
  uVar2 = (uVar8 << 4 | uVar8 >> 0x1c) ^ iVar7 - uVar8;
  sVar1 = sVar1 - 0xc;
  data = (void *)((long)data + 0xc);
  uVar8 = uVar8 + uVar5;
  goto LAB_00112bc2;
switchD_00112cb2_default:
  uVar2 = uVar2 + *(uint *)((long)data + 8);
  uVar6 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar6 + *data) - uVar2;
  iVar3 = uVar2 + uVar8 + *(uint *)((long)data + 4);
  uVar8 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar8 + *(uint *)((long)data + 4)) - uVar6;
  iVar7 = uVar6 + iVar3;
  uVar2 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar3 - uVar8;
  iVar3 = uVar8 + iVar7;
  uVar6 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar7 - uVar2;
  iVar7 = uVar2 + iVar3;
  uVar8 = (uVar6 << 0x13 | uVar6 >> 0xd) ^ iVar3 - uVar6;
  uVar6 = uVar6 + iVar7;
  uVar2 = (uVar8 << 4 | uVar8 >> 0x1c) ^ iVar7 - uVar8;
  sVar1 = sVar1 - 0xc;
  data = (void *)((long)data + 0xc);
  uVar8 = uVar8 + uVar6;
  goto LAB_00112c37;
}

Assistant:

void ecs_hash(
    const void *data,
    ecs_size_t length,
    uint64_t *result)
{
    uint32_t h_1 = 0;
    uint32_t h_2 = 0;

    hashlittle2(
        data,
        ecs_to_size_t(length),
        &h_1,
        &h_2);

    *result = h_1 | ((uint64_t)h_2 << 32);
}